

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O2

int mg_split_form_urlencoded(char *data,mg_header *form_fields,uint num_form_fields)

{
  int iVar1;
  uint uVar2;
  char cVar3;
  char *pcVar4;
  long lVar5;
  ulong uVar6;
  
  uVar2 = 0xffffffff;
  if (data != (char *)0x0) {
    if (num_form_fields == 0 && form_fields == (mg_header *)0x0) {
      cVar3 = *data;
      if (cVar3 != '\0') {
        pcVar4 = data + 1;
        iVar1 = 1;
        do {
          if (cVar3 == '&') {
            iVar1 = iVar1 + 1;
          }
          else if (cVar3 == '\0') {
            return iVar1;
          }
          cVar3 = *pcVar4;
          pcVar4 = pcVar4 + 1;
        } while( true );
      }
      uVar2 = 0;
    }
    else if (0 < (int)num_form_fields && form_fields != (mg_header *)0x0) {
      uVar6 = 0;
      while (pcVar4 = data, uVar6 != num_form_fields) {
        while( true ) {
          pcVar4 = pcVar4 + 1;
          cVar3 = *data;
          if ((cVar3 != '\t') && (cVar3 != ' ')) break;
          data = data + 1;
        }
        if (cVar3 == '\0') {
LAB_0010dd79:
          num_form_fields = (uint)uVar6;
          break;
        }
        form_fields[uVar6].name = data;
        for (; (cVar3 = pcVar4[-1], cVar3 != '\0' && (cVar3 != '&')); pcVar4 = pcVar4 + 1) {
          if (cVar3 == '=') {
            pcVar4[-1] = '\0';
            data = pcVar4;
            goto LAB_0010dd5a;
          }
        }
        pcVar4 = (char *)0x0;
LAB_0010dd5a:
        form_fields[uVar6].value = pcVar4;
        uVar6 = uVar6 + 1;
        pcVar4 = strchr(data,0x26);
        if (pcVar4 == (char *)0x0) goto LAB_0010dd79;
        *pcVar4 = '\0';
        data = pcVar4 + 1;
      }
      lVar5 = 0;
      uVar6 = 0;
      if (0 < (int)num_form_fields) {
        uVar6 = (ulong)num_form_fields;
      }
      for (; uVar2 = num_form_fields, uVar6 * 0x10 != lVar5; lVar5 = lVar5 + 0x10) {
        pcVar4 = *(char **)((long)&form_fields->name + lVar5);
        if (pcVar4 != (char *)0x0) {
          url_decode_in_place(pcVar4);
        }
        pcVar4 = *(char **)((long)&form_fields->value + lVar5);
        if (pcVar4 != (char *)0x0) {
          url_decode_in_place(pcVar4);
        }
      }
    }
  }
  return uVar2;
}

Assistant:

CIVETWEB_API int
mg_split_form_urlencoded(char *data,
                         struct mg_header *form_fields,
                         unsigned num_form_fields)
{
	char *b;
	int i;
	int num = 0;

	if (data == NULL) {
		/* parameter error */
		return -1;
	}

	if ((form_fields == NULL) && (num_form_fields == 0)) {
		/* determine the number of expected fields */
		if (data[0] == 0) {
			return 0;
		}
		/* count number of & to return the number of key-value-pairs */
		num = 1;
		while (*data) {
			if (*data == '&') {
				num++;
			}
			data++;
		}
		return num;
	}

	if ((form_fields == NULL) || ((int)num_form_fields <= 0)) {
		/* parameter error */
		return -1;
	}

	for (i = 0; i < (int)num_form_fields; i++) {
		/* extract key-value pairs from input data */
		while ((*data == ' ') || (*data == '\t')) {
			/* skip initial spaces */
			data++;
		}
		if (*data == 0) {
			/* end of string reached */
			break;
		}
		form_fields[num].name = data;

		/* find & or = */
		b = data;
		while ((*b != 0) && (*b != '&') && (*b != '=')) {
			b++;
		}

		if (*b == 0) {
			/* last key without value */
			form_fields[num].value = NULL;
		} else if (*b == '&') {
			/* mid key without value */
			form_fields[num].value = NULL;
		} else {
			/* terminate string */
			*b = 0;
			/* value starts after '=' */
			data = b + 1;
			form_fields[num].value = data;
		}

		/* new field is stored */
		num++;

		/* find a next key */
		b = strchr(data, '&');
		if (b == 0) {
			/* no more data */
			break;
		} else {
			/* terminate value of last field at '&' */
			*b = 0;
			/* next key-value-pairs starts after '&' */
			data = b + 1;
		}
	}

	/* Decode all values */
	for (i = 0; i < num; i++) {
		if (form_fields[i].name) {
			url_decode_in_place((char *)form_fields[i].name);
		}
		if (form_fields[i].value) {
			url_decode_in_place((char *)form_fields[i].value);
		}
	}

	/* return number of fields found */
	return num;
}